

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

FixedTypedVector * __thiscall
flexbuffers::Reference::AsFixedTypedVector(FixedTypedVector *__return_storage_ptr__,Reference *this)

{
  Type TVar1;
  ulong in_RAX;
  uint8_t *puVar2;
  uint8_t uVar3;
  ulong uStack_28;
  uint8_t len;
  
  if (this->type_ - FBT_VECTOR_INT2 < 9) {
    uStack_28 = in_RAX & 0xffffffffffffff;
    TVar1 = ToFixedTypedVectorElementType(this->type_,&len);
    puVar2 = Indirect(this);
    uVar3 = this->byte_width_;
  }
  else {
    TVar1 = FBT_INT;
    uVar3 = '\x01';
    puVar2 = "";
    len = '\0';
  }
  (__return_storage_ptr__->super_Object).data_ = puVar2;
  (__return_storage_ptr__->super_Object).byte_width_ = uVar3;
  *(Type *)&(__return_storage_ptr__->super_Object).field_0xc = TVar1;
  __return_storage_ptr__->len_ = len;
  return __return_storage_ptr__;
}

Assistant:

FixedTypedVector AsFixedTypedVector() const {
    if (IsFixedTypedVector()) {
      uint8_t len = 0;
      auto vtype = ToFixedTypedVectorElementType(type_, &len);
      return FixedTypedVector(Indirect(), byte_width_, vtype, len);
    } else {
      return FixedTypedVector::EmptyFixedTypedVector();
    }
  }